

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

void trie_destroy(trie t)

{
  void *__ptr;
  int iVar1;
  void *in_RDI;
  trie_node_free_conflict free_node;
  trie in_stack_ffffffffffffffe8;
  
  if (in_RDI != (void *)0x0) {
    iVar1 = trie_clear(in_stack_ffffffffffffffe8);
    if (iVar1 != 0) {
      log_write_impl_va("metacall",0x329,"trie_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                        ,LOG_LEVEL_ERROR,"Trie invalid destruction");
    }
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    while (*(long *)((long)in_RDI + 0x20) != 0) {
      __ptr = *(void **)((long)in_RDI + 0x20);
      *(undefined8 *)((long)in_RDI + 0x20) = **(undefined8 **)((long)in_RDI + 0x20);
      free(__ptr);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void trie_destroy(trie t)
{
	if (t != NULL)
	{
		if (trie_clear(t) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid destruction");
		}

		if (t->node_list != NULL)
		{
			free(t->node_list);
		}

		while (t->free_node_list != NULL)
		{
			trie_node_free free_node = t->free_node_list;

			t->free_node_list = t->free_node_list->next;

			free(free_node);
		}

		free(t);
	}
}